

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false,_true>::
BlockImpl_dense(BlockImpl_dense<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false,_true> *this,
               Matrix<float,_8,_1,_0,_8,_1> *xpr,Index i)

{
  MapBase<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>,_0> *)this,
             (xpr->super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>).m_storage.m_data.
             array + i,1,1);
  this->m_xpr = xpr;
  (this->m_startRow).m_value = i;
  this->m_outerStride = 8;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }